

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O2

LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> * __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::operator*
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *__return_storage_ptr__
          ,LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *this,KFLOAT64 Value)

{
  KFIXED<short,_(unsigned_char)__x03_> local_70;
  KFIXED<short,_(unsigned_char)__x03_> local_60;
  KFIXED<short,_(unsigned_char)__x03_> local_50;
  KFIXED<short,_(unsigned_char)__x03_> local_40;
  KFIXED<short,_(unsigned_char)__x03_> local_30;
  KFIXED<short,_(unsigned_char)__x03_> local_20;
  
  LE_Vector(__return_storage_ptr__,this);
  KFIXED<short,_(unsigned_char)'\x03'>::operator*(&local_50,Value);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_20,&__return_storage_ptr__->m_X);
  DataTypeBase::~DataTypeBase(&local_20.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_50.super_DataTypeBase);
  KFIXED<short,_(unsigned_char)'\x03'>::operator*(&local_60,Value);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_30,&__return_storage_ptr__->m_Y);
  DataTypeBase::~DataTypeBase(&local_30.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_60.super_DataTypeBase);
  KFIXED<short,_(unsigned_char)'\x03'>::operator*(&local_70,Value);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_40,&__return_storage_ptr__->m_Z);
  DataTypeBase::~DataTypeBase(&local_40.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_70.super_DataTypeBase);
  return __return_storage_ptr__;
}

Assistant:

LE_Vector<Type> LE_Vector<Type>::operator * ( KFLOAT64 Value ) const
{
    LE_Vector tmp = *this;
    tmp.m_X = tmp.m_X * Value;
    tmp.m_Y = tmp.m_Y * Value;
    tmp.m_Z = tmp.m_Z * Value;
    return tmp;
}